

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdStoreLane<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  uchar uVar1;
  bool bVar2;
  pointer puVar3;
  pointer puVar4;
  Store *this_00;
  Memory *pMVar5;
  ulong uVar6;
  ulong uVar7;
  RunResult RVar8;
  ulong uVar9;
  Value VVar10;
  Simd<unsigned_char,_(unsigned_char)__x10_> result;
  RefPtr<wabt::interp::Memory> local_98;
  anon_union_16_6_113bff37_for_Value_0 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_98,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  local_78.v128_.v = (v128)Pop(this);
  pMVar5 = local_98.obj_;
  uVar1 = *(uchar *)((long)&local_78 + (ulong)instr.field_2.imm_v128.v[8]);
  bVar2 = ((local_98.obj_)->type_).limits.is_64;
  VVar10 = Pop(this);
  uVar7 = (ulong)VVar10.field_0.i32_;
  if (bVar2 != false) {
    uVar7 = VVar10.field_0.i64_;
  }
  uVar6 = (ulong)instr.field_2.imm_u32x2.snd;
  puVar3 = (pMVar5->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (pMVar5->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar9 = (long)puVar4 - (long)puVar3;
  if ((((puVar4 == puVar3) || (uVar9 < uVar7)) || (uVar9 < uVar6)) || (uVar9 < uVar7 + uVar6 + 1)) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_68,"out of bounds memory access: access at %lu+%zd >= max value %lu",
               uVar7 + uVar6,1,
               (long)((local_98.obj_)->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)((local_98.obj_)->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar8 = Trap;
  }
  else {
    puVar3[uVar6 + uVar7] = uVar1;
    RVar8 = Ok;
  }
  if (local_98.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_98.store_,local_98.root_index_);
  }
  return RVar8;
}

Assistant:

RunResult Thread::DoSimdStoreLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2_u8.fst]};
  auto result = Pop<S>();
  T val = result[instr.imm_u32x2_u8.idx];
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->Store(offset, instr.imm_u32x2_u8.snd, val)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %" PRIu64,
                       offset + instr.imm_u32x2_u8.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}